

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.h
# Opt level: O3

void __thiscall
jrtplib::RTPFakeTransmissionInfo::RTPFakeTransmissionInfo
          (RTPFakeTransmissionInfo *this,list<unsigned_int,_std::allocator<unsigned_int>_> *iplist,
          RTPFakeTransmissionParams *transparams)

{
  list<unsigned_int,_std::allocator<unsigned_int>_> *plVar1;
  
  (this->super_RTPTransmissionInfo).protocol = UserDefinedProto;
  (this->super_RTPTransmissionInfo)._vptr_RTPTransmissionInfo =
       (_func_int **)&PTR__RTPFakeTransmissionInfo_00144b60;
  plVar1 = &this->localIPlist;
  (this->localIPlist).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->localIPlist).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->localIPlist).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  _M_size = 0;
  if (plVar1 != iplist) {
    std::__cxx11::list<unsigned_int,std::allocator<unsigned_int>>::
    _M_assign_dispatch<std::_List_const_iterator<unsigned_int>>
              ((list<unsigned_int,std::allocator<unsigned_int>> *)plVar1,
               (iplist->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               _M_node.super__List_node_base._M_next,iplist);
  }
  this->params = transparams;
  return;
}

Assistant:

RTPFakeTransmissionInfo(std::list<uint32_t> iplist,
            RTPFakeTransmissionParams *transparams) : 
        RTPTransmissionInfo(RTPTransmitter::UserDefinedProto) 
    { localIPlist = iplist; params = transparams; }